

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFieldName
          (FastFieldValuePrinter *this,Message *param_1,Reflection *param_2,FieldDescriptor *field,
          BaseTextGenerator *generator)

{
  bool bVar1;
  Descriptor *this_00;
  string_view sVar2;
  BaseTextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *param_2_local;
  Message *param_1_local;
  FastFieldValuePrinter *this_local;
  
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    BaseTextGenerator::PrintLiteral<2ul>(generator,(char (*) [2])0x8166ef);
    sVar2 = FieldDescriptor::PrintableNameForExtension(field);
    BaseTextGenerator::PrintString(generator,sVar2);
    BaseTextGenerator::PrintLiteral<2ul>(generator,(char (*) [2])0x831456);
  }
  else {
    bVar1 = internal::cpp::IsGroupLike(field);
    if (bVar1) {
      this_00 = FieldDescriptor::message_type(field);
      sVar2 = Descriptor::name(this_00);
      BaseTextGenerator::PrintString(generator,sVar2);
    }
    else {
      sVar2 = FieldDescriptor::name(field);
      BaseTextGenerator::PrintString(generator,sVar2);
    }
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFieldName(
    const Message& /*message*/, const Reflection* /*reflection*/,
    const FieldDescriptor* field, BaseTextGenerator* generator) const {
  if (field->is_extension()) {
    generator->PrintLiteral("[");
    generator->PrintString(field->PrintableNameForExtension());
    generator->PrintLiteral("]");
  } else if (internal::cpp::IsGroupLike(*field)) {
    // Groups must be serialized with their original capitalization.
    generator->PrintString(field->message_type()->name());
  } else {
    generator->PrintString(field->name());
  }
}